

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveFinder.cpp
# Opt level: O0

void __thiscall
senjo::MoveFinder::AddKnightMoves
          (MoveFinder *this,
          set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_> *origins,
          int x,int y,char cap,list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *moves)

{
  bool bVar1;
  Direction DVar2;
  reference other;
  Square *pSVar3;
  Square local_84;
  Square local_80;
  Square local_7c;
  Square local_78;
  Square local_74;
  Square local_70;
  Square local_6c;
  Square local_68;
  Square local_64;
  _Self local_60;
  _Base_ptr local_58;
  _Rb_tree_const_iterator<senjo::Square> local_50;
  const_iterator it;
  Square dest;
  Direction direction;
  ChessMove move;
  list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *moves_local;
  char cap_local;
  int y_local;
  int x_local;
  set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_> *origins_local;
  MoveFinder *this_local;
  
  move._4_8_ = moves;
  ChessMove::ChessMove((ChessMove *)&dest);
  Square::Square((Square *)((long)&it._M_node + 4),0x78);
  std::_Rb_tree_const_iterator<senjo::Square>::_Rb_tree_const_iterator(&local_50);
  local_58 = (_Base_ptr)
             std::set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>::
             begin(origins);
  local_50._M_node = local_58;
  while( true ) {
    local_60._M_node =
         (_Base_ptr)
         std::set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>::end
                   (origins);
    bVar1 = std::operator!=(&local_50,&local_60);
    if (!bVar1) break;
    other = std::_Rb_tree_const_iterator<senjo::Square>::operator*(&local_50);
    Square::operator=((Square *)&direction,other);
    Square::Square(&local_64,x,y);
    DVar2 = Square::DirectionTo((Square *)&direction,&local_64);
    if ((DVar2 == Unknown) || (DVar2 == KnightMove1)) {
      Square::operator+(&local_68,(int)&dest + 4);
      pSVar3 = Square::operator=((Square *)((long)&it._M_node + 4),&local_68);
      bVar1 = Square::IsValid(pSVar3);
      if (bVar1) {
        AddMove(this,(ChessMove *)&dest,(Square *)((long)&it._M_node + 4),x,y,cap,
                (list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *)move._4_8_);
      }
    }
    if ((DVar2 == Unknown) || (DVar2 == KnightMove2)) {
      Square::operator+(&local_6c,(int)&dest + 4);
      pSVar3 = Square::operator=((Square *)((long)&it._M_node + 4),&local_6c);
      bVar1 = Square::IsValid(pSVar3);
      if (bVar1) {
        AddMove(this,(ChessMove *)&dest,(Square *)((long)&it._M_node + 4),x,y,cap,
                (list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *)move._4_8_);
      }
    }
    if ((DVar2 == Unknown) || (DVar2 == KnightMove3)) {
      Square::operator+(&local_70,(int)&dest + 4);
      pSVar3 = Square::operator=((Square *)((long)&it._M_node + 4),&local_70);
      bVar1 = Square::IsValid(pSVar3);
      if (bVar1) {
        AddMove(this,(ChessMove *)&dest,(Square *)((long)&it._M_node + 4),x,y,cap,
                (list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *)move._4_8_);
      }
    }
    if ((DVar2 == Unknown) || (DVar2 == KnightMove4)) {
      Square::operator+(&local_74,(int)&dest + 4);
      pSVar3 = Square::operator=((Square *)((long)&it._M_node + 4),&local_74);
      bVar1 = Square::IsValid(pSVar3);
      if (bVar1) {
        AddMove(this,(ChessMove *)&dest,(Square *)((long)&it._M_node + 4),x,y,cap,
                (list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *)move._4_8_);
      }
    }
    if ((DVar2 == Unknown) || (DVar2 == KnightMove5)) {
      Square::operator+(&local_78,(int)&dest + 4);
      pSVar3 = Square::operator=((Square *)((long)&it._M_node + 4),&local_78);
      bVar1 = Square::IsValid(pSVar3);
      if (bVar1) {
        AddMove(this,(ChessMove *)&dest,(Square *)((long)&it._M_node + 4),x,y,cap,
                (list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *)move._4_8_);
      }
    }
    if ((DVar2 == Unknown) || (DVar2 == KnightMove6)) {
      Square::operator+(&local_7c,(int)&dest + 4);
      pSVar3 = Square::operator=((Square *)((long)&it._M_node + 4),&local_7c);
      bVar1 = Square::IsValid(pSVar3);
      if (bVar1) {
        AddMove(this,(ChessMove *)&dest,(Square *)((long)&it._M_node + 4),x,y,cap,
                (list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *)move._4_8_);
      }
    }
    if ((DVar2 == Unknown) || (DVar2 == KnightMove7)) {
      Square::operator+(&local_80,(int)&dest + 4);
      pSVar3 = Square::operator=((Square *)((long)&it._M_node + 4),&local_80);
      bVar1 = Square::IsValid(pSVar3);
      if (bVar1) {
        AddMove(this,(ChessMove *)&dest,(Square *)((long)&it._M_node + 4),x,y,cap,
                (list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *)move._4_8_);
      }
    }
    if ((DVar2 == Unknown) || (DVar2 == KnightMove8)) {
      Square::operator+(&local_84,(int)&dest + 4);
      pSVar3 = Square::operator=((Square *)((long)&it._M_node + 4),&local_84);
      bVar1 = Square::IsValid(pSVar3);
      if (bVar1) {
        AddMove(this,(ChessMove *)&dest,(Square *)((long)&it._M_node + 4),x,y,cap,
                (list<senjo::ChessMove,_std::allocator<senjo::ChessMove>_> *)move._4_8_);
      }
    }
    std::_Rb_tree_const_iterator<senjo::Square>::operator++(&local_50);
  }
  return;
}

Assistant:

void MoveFinder::AddKnightMoves(const std::set<Square>& origins,
                                const int x, const int y, const char cap,
                                std::list<ChessMove>& moves) const
{
  ChessMove move;
  Direction direction;
  Square    dest;
  std::set<Square>::const_iterator it;
  for (it = origins.begin(); it != origins.end(); ++it) {
    move.from = *it;
    direction = move.from.DirectionTo(Square(x, y));
    if ((direction == Direction::Unknown) || (direction == KnightMove1)) {
      if ((dest = (move.from + KnightMove1)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove2)) {
      if ((dest = (move.from + KnightMove2)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove3)) {
      if ((dest = (move.from + KnightMove3)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove4)) {
      if ((dest = (move.from + KnightMove4)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove5)) {
      if ((dest = (move.from + KnightMove5)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove6)) {
      if ((dest = (move.from + KnightMove6)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove7)) {
      if ((dest = (move.from + KnightMove7)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
    if ((direction == Direction::Unknown) || (direction == KnightMove8)) {
      if ((dest = (move.from + KnightMove8)).IsValid()) {
        AddMove(move, dest, x, y, cap, moves);
      }
    }
  }
}